

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void save_regions(memfile *mf,level *lev)

{
  region *prVar1;
  xchar xVar2;
  size_t sVar3;
  uint local_48;
  uint local_40;
  region *r;
  uint len2;
  uint len1;
  int j;
  int i;
  level *lev_local;
  memfile *mf_local;
  
  xVar2 = ledger_no(&lev->z);
  mtag(mf,(long)xVar2,MTAG_REGION);
  mfmagic_set(mf,0x49474552);
  mwrite32(mf,moves);
  mwrite32(mf,lev->n_regions);
  for (len1 = 0; (int)len1 < lev->n_regions; len1 = len1 + 1) {
    prVar1 = lev->regions[(int)len1];
    mwrite(mf,&prVar1->bounding_box,4);
    mwrite32(mf,prVar1->attach_2_m);
    mwrite32(mf,prVar1->effect_id);
    mwrite32(mf,prVar1->arg);
    mwrite16(mf,prVar1->nrects);
    for (len2 = 0; (int)len2 < (int)prVar1->nrects; len2 = len2 + 1) {
      mwrite(mf,prVar1->rects + (int)len2,4);
    }
    mwrite16(mf,prVar1->ttl);
    mwrite16(mf,prVar1->expire_f);
    mwrite16(mf,prVar1->can_enter_f);
    mwrite16(mf,prVar1->enter_f);
    mwrite16(mf,prVar1->can_leave_f);
    mwrite16(mf,prVar1->leave_f);
    mwrite16(mf,prVar1->inside_f);
    mwrite16(mf,prVar1->n_monst);
    mwrite8(mf,prVar1->player_flags);
    mwrite8(mf,prVar1->attach_2_u);
    mwrite8(mf,prVar1->visible);
    for (len2 = 0; (int)len2 < (int)prVar1->n_monst; len2 = len2 + 1) {
      mwrite32(mf,prVar1->monsters[(int)len2]);
    }
    if (prVar1->enter_msg == (char *)0x0) {
      local_40 = 0;
    }
    else {
      sVar3 = strlen(prVar1->enter_msg);
      local_40 = (int)sVar3 + 1;
    }
    mwrite16(mf,(int16_t)local_40);
    if (prVar1->leave_msg == (char *)0x0) {
      local_48 = 0;
    }
    else {
      sVar3 = strlen(prVar1->leave_msg);
      local_48 = (int)sVar3 + 1;
    }
    mwrite16(mf,(int16_t)local_48);
    if (local_40 != 0) {
      mwrite(mf,prVar1->enter_msg,local_40);
    }
    if (local_48 != 0) {
      mwrite(mf,prVar1->leave_msg,local_48);
    }
  }
  return;
}

Assistant:

void save_regions(struct memfile *mf, struct level *lev)
{
    int i, j;
    unsigned len1, len2;
    struct region *r;

    mtag(mf, ledger_no(&lev->z), MTAG_REGION);
    mfmagic_set(mf, REGION_MAGIC);
    mwrite32(mf, moves);	/* timestamp */
    mwrite32(mf, lev->n_regions);

    /*
     * Note: level regions don't have ID numbers, so we can't tag
     * individual regions; instead, diff efficiency depends on the
     * fact that regions tend to stay in the order and are typically
     * inserted or deleted near the end of the list.
     */
    for (i = 0; i < lev->n_regions; i++) {
	r = lev->regions[i];

	mwrite(mf, &r->bounding_box, sizeof (struct nhrect));
	mwrite32(mf, r->attach_2_m);
	mwrite32(mf, r->effect_id);
	mwrite32(mf, r->arg);
	mwrite16(mf, r->nrects);
	for (j = 0; j < r->nrects; j++)
	    mwrite(mf, &r->rects[j], sizeof (struct nhrect));
	mwrite16(mf, r->ttl);
	mwrite16(mf, r->expire_f);
	mwrite16(mf, r->can_enter_f);
	mwrite16(mf, r->enter_f);
	mwrite16(mf, r->can_leave_f);
	mwrite16(mf, r->leave_f);
	mwrite16(mf, r->inside_f);
	mwrite16(mf, r->n_monst);
	mwrite8(mf, r->player_flags);
	mwrite8(mf, r->attach_2_u);
	mwrite8(mf, r->visible);

	for (j = 0; j < r->n_monst; j++)
	    mwrite32(mf, r->monsters[j]);

	len1 = r->enter_msg ? strlen(r->enter_msg) + 1 : 0;
	mwrite16(mf, len1);
	len2 = r->leave_msg ? strlen(r->leave_msg) + 1 : 0;
	mwrite16(mf, len2);

	if (len1 > 0)
	    mwrite(mf, r->enter_msg, len1);

	if (len2 > 0)
	    mwrite(mf, r->leave_msg, len2);
    }
}